

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFRewriteDirectory(TIFF *tif)

{
  int iVar1;
  long lVar2;
  undefined8 local_58;
  uint64_t m_1;
  uint64_t nextnextdir_1;
  ulong uStack_40;
  uint16_t dircount_1;
  uint64_t dircount64;
  uint64_t nextdir_1;
  uint32_t m;
  uint32_t nextnextdir;
  uint16_t dircount;
  uint64_t uStack_20;
  uint32_t nextdir;
  uint64_t torewritediroff;
  TIFF *tif_local;
  
  torewritediroff = (uint64_t)tif;
  if (tif->tif_diroff == 0) {
    iVar1 = TIFFWriteDirectory(tif);
    return iVar1;
  }
  uStack_20 = tif->tif_diroff;
  if ((tif->tif_flags & 0x80000) == 0) {
    if ((ulong)(tif->tif_header).classic.tiff_diroff == tif->tif_diroff) {
      (tif->tif_header).classic.tiff_diroff = 0;
      tif->tif_diroff = 0;
      (*tif->tif_seekproc)(tif->tif_clientdata,4,0);
      lVar2 = (**(code **)(torewritediroff + 0x460))
                        (*(undefined8 *)(torewritediroff + 0x450),torewritediroff + 0x2fc,4);
      if (lVar2 != 4) {
        TIFFErrorExtR((TIFF *)torewritediroff,*(char **)torewritediroff,"Error updating TIFF header"
                     );
        return 0;
      }
    }
    else {
      if (0xffffffff < tif->tif_diroff) {
        TIFFErrorExtR(tif,"TIFFRewriteDirectory",
                      "tif->tif_diroff exceeds 32 bit range allowed for Classic TIFF");
        return 0;
      }
      nextnextdir = (tif->tif_header).classic.tiff_diroff;
      while( true ) {
        iVar1 = _TIFFSeekOK((TIFF *)torewritediroff,(ulong)nextnextdir);
        if ((iVar1 == 0) ||
           (lVar2 = (**(code **)(torewritediroff + 0x458))
                              (*(undefined8 *)(torewritediroff + 0x450),(long)&m + 2,2), lVar2 != 2)
           ) {
          TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory",
                        "Error fetching directory count");
          return 0;
        }
        if ((*(uint *)(torewritediroff + 0x10) & 0x80) != 0) {
          TIFFSwabShort((uint16_t *)((long)&m + 2));
        }
        (**(code **)(torewritediroff + 0x468))
                  (*(undefined8 *)(torewritediroff + 0x450),nextnextdir + 2 + (uint)m._2_2_ * 0xc,0)
        ;
        lVar2 = (**(code **)(torewritediroff + 0x458))
                          (*(undefined8 *)(torewritediroff + 0x450),(long)&nextdir_1 + 4,4);
        if (lVar2 != 4) {
          TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory",
                        "Error fetching directory link");
          return 0;
        }
        if ((*(uint *)(torewritediroff + 0x10) & 0x80) != 0) {
          TIFFSwabLong((uint32_t *)((long)&nextdir_1 + 4));
        }
        if ((ulong)nextdir_1._4_4_ == *(ulong *)(torewritediroff + 0x18)) break;
        nextnextdir = nextdir_1._4_4_;
      }
      nextdir_1._0_4_ = 0;
      (**(code **)(torewritediroff + 0x468))
                (*(undefined8 *)(torewritediroff + 0x450),nextnextdir + 2 + (uint)m._2_2_ * 0xc,0);
      lVar2 = (**(code **)(torewritediroff + 0x460))
                        (*(undefined8 *)(torewritediroff + 0x450),&nextdir_1,4);
      if (lVar2 != 4) {
        TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory","Error writing directory link")
        ;
        return 0;
      }
      *(undefined8 *)(torewritediroff + 0x18) = 0;
      *(undefined8 *)(torewritediroff + 0x28) = 0;
    }
    _TIFFRemoveEntryFromDirectoryListByOffset((TIFF *)torewritediroff,uStack_20);
  }
  else {
    if ((tif->tif_header).big.tiff_diroff == tif->tif_diroff) {
      (tif->tif_header).big.tiff_diroff = 0;
      tif->tif_diroff = 0;
      (*tif->tif_seekproc)(tif->tif_clientdata,8,0);
      lVar2 = (**(code **)(torewritediroff + 0x460))
                        (*(undefined8 *)(torewritediroff + 0x450),torewritediroff + 0x300,8);
      if (lVar2 != 8) {
        TIFFErrorExtR((TIFF *)torewritediroff,*(char **)torewritediroff,"Error updating TIFF header"
                     );
        return 0;
      }
    }
    else {
      dircount64 = (tif->tif_header).big.tiff_diroff;
      while( true ) {
        iVar1 = _TIFFSeekOK((TIFF *)torewritediroff,dircount64);
        if ((iVar1 == 0) ||
           (lVar2 = (**(code **)(torewritediroff + 0x458))
                              (*(undefined8 *)(torewritediroff + 0x450),&stack0xffffffffffffffc0,8),
           lVar2 != 8)) {
          TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory",
                        "Error fetching directory count");
          return 0;
        }
        if ((*(uint *)(torewritediroff + 0x10) & 0x80) != 0) {
          TIFFSwabLong8(&stack0xffffffffffffffc0);
        }
        if (0xffff < uStack_40) {
          TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory",
                        "Sanity check on tag count failed, likely corrupt TIFF");
          return 0;
        }
        nextnextdir_1._6_2_ = (ushort)uStack_40;
        (**(code **)(torewritediroff + 0x468))
                  (*(undefined8 *)(torewritediroff + 0x450),
                   dircount64 + 8 + (long)(int)((uint)nextnextdir_1._6_2_ * 0x14),0);
        lVar2 = (**(code **)(torewritediroff + 0x458))
                          (*(undefined8 *)(torewritediroff + 0x450),&m_1,8);
        if (lVar2 != 8) {
          TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory",
                        "Error fetching directory link");
          return 0;
        }
        if ((*(uint *)(torewritediroff + 0x10) & 0x80) != 0) {
          TIFFSwabLong8(&m_1);
        }
        if (m_1 == *(uint64_t *)(torewritediroff + 0x18)) break;
        dircount64 = m_1;
      }
      local_58 = 0;
      (**(code **)(torewritediroff + 0x468))
                (*(undefined8 *)(torewritediroff + 0x450),
                 dircount64 + 8 + (long)(int)((uint)nextnextdir_1._6_2_ * 0x14),0);
      lVar2 = (**(code **)(torewritediroff + 0x460))
                        (*(undefined8 *)(torewritediroff + 0x450),&local_58,8);
      if (lVar2 != 8) {
        TIFFErrorExtR((TIFF *)torewritediroff,"TIFFRewriteDirectory","Error writing directory link")
        ;
        return 0;
      }
      *(undefined8 *)(torewritediroff + 0x18) = 0;
      *(undefined8 *)(torewritediroff + 0x28) = 0;
    }
    _TIFFRemoveEntryFromDirectoryListByOffset((TIFF *)torewritediroff,uStack_20);
  }
  iVar1 = TIFFWriteDirectory((TIFF *)torewritediroff);
  return iVar1;
}

Assistant:

int TIFFRewriteDirectory(TIFF *tif)
{
    static const char module[] = "TIFFRewriteDirectory";

    /* We don't need to do anything special if it hasn't been written. */
    if (tif->tif_diroff == 0)
        return TIFFWriteDirectory(tif);

    /*
     * Find and zero the pointer to this directory, so that TIFFLinkDirectory
     * will cause it to be added after this directories current pre-link.
     */
    uint64_t torewritediroff = tif->tif_diroff;

    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        if (tif->tif_header.classic.tiff_diroff == tif->tif_diroff)
        {
            tif->tif_header.classic.tiff_diroff = 0;
            tif->tif_diroff = 0;

            TIFFSeekFile(tif, 4, SEEK_SET);
            if (!WriteOK(tif, &(tif->tif_header.classic.tiff_diroff), 4))
            {
                TIFFErrorExtR(tif, tif->tif_name, "Error updating TIFF header");
                return (0);
            }
        }
        else if (tif->tif_diroff > 0xFFFFFFFFU)
        {
            TIFFErrorExtR(tif, module,
                          "tif->tif_diroff exceeds 32 bit range allowed for "
                          "Classic TIFF");
            return (0);
        }
        else
        {
            uint32_t nextdir;
            nextdir = tif->tif_header.classic.tiff_diroff;
            while (1)
            {
                uint16_t dircount;
                uint32_t nextnextdir;

                if (!SeekOK(tif, nextdir) || !ReadOK(tif, &dircount, 2))
                {
                    TIFFErrorExtR(tif, module,
                                  "Error fetching directory count");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(&dircount);
                (void)TIFFSeekFile(tif, nextdir + 2 + dircount * 12, SEEK_SET);
                if (!ReadOK(tif, &nextnextdir, 4))
                {
                    TIFFErrorExtR(tif, module, "Error fetching directory link");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextnextdir);
                if (nextnextdir == tif->tif_diroff)
                {
                    uint32_t m;
                    m = 0;
                    (void)TIFFSeekFile(tif, nextdir + 2 + dircount * 12,
                                       SEEK_SET);
                    if (!WriteOK(tif, &m, 4))
                    {
                        TIFFErrorExtR(tif, module,
                                      "Error writing directory link");
                        return (0);
                    }
                    tif->tif_diroff = 0;
                    /* Force a full-traversal to reach the zeroed pointer */
                    tif->tif_lastdiroff = 0;
                    break;
                }
                nextdir = nextnextdir;
            }
        }
        /* Remove skipped offset from IFD loop directory list. */
        _TIFFRemoveEntryFromDirectoryListByOffset(tif, torewritediroff);
    }
    else
    {
        if (tif->tif_header.big.tiff_diroff == tif->tif_diroff)
        {
            tif->tif_header.big.tiff_diroff = 0;
            tif->tif_diroff = 0;

            TIFFSeekFile(tif, 8, SEEK_SET);
            if (!WriteOK(tif, &(tif->tif_header.big.tiff_diroff), 8))
            {
                TIFFErrorExtR(tif, tif->tif_name, "Error updating TIFF header");
                return (0);
            }
        }
        else
        {
            uint64_t nextdir;
            nextdir = tif->tif_header.big.tiff_diroff;
            while (1)
            {
                uint64_t dircount64;
                uint16_t dircount;
                uint64_t nextnextdir;

                if (!SeekOK(tif, nextdir) || !ReadOK(tif, &dircount64, 8))
                {
                    TIFFErrorExtR(tif, module,
                                  "Error fetching directory count");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(&dircount64);
                if (dircount64 > 0xFFFF)
                {
                    TIFFErrorExtR(tif, module,
                                  "Sanity check on tag count failed, likely "
                                  "corrupt TIFF");
                    return (0);
                }
                dircount = (uint16_t)dircount64;
                (void)TIFFSeekFile(tif, nextdir + 8 + dircount * 20, SEEK_SET);
                if (!ReadOK(tif, &nextnextdir, 8))
                {
                    TIFFErrorExtR(tif, module, "Error fetching directory link");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(&nextnextdir);
                if (nextnextdir == tif->tif_diroff)
                {
                    uint64_t m;
                    m = 0;
                    (void)TIFFSeekFile(tif, nextdir + 8 + dircount * 20,
                                       SEEK_SET);
                    if (!WriteOK(tif, &m, 8))
                    {
                        TIFFErrorExtR(tif, module,
                                      "Error writing directory link");
                        return (0);
                    }
                    tif->tif_diroff = 0;
                    /* Force a full-traversal to reach the zeroed pointer */
                    tif->tif_lastdiroff = 0;
                    break;
                }
                nextdir = nextnextdir;
            }
        }
        /* Remove skipped offset from IFD loop directory list. */
        _TIFFRemoveEntryFromDirectoryListByOffset(tif, torewritediroff);
    }

    /*
     * Now use TIFFWriteDirectory() normally.
     */

    return TIFFWriteDirectory(tif);
}